

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_Grp14.c
# Opt level: O3

void G14_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  UIntPtr UVar2;
  ulong uVar3;
  byte bVar4;
  Int32 IVar5;
  Int32 IVar6;
  uint uVar7;
  OPTYPE *pMyOperand;
  bool bVar8;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    UVar1 = (pMyDisasm->Reserved_).VEX.pp;
    if ((UVar1 == '\x02') || (UVar1 != '\x01')) goto switchD_0012152a_caseD_4;
    UVar2 = (pMyDisasm->Reserved_).EIP_;
    uVar3 = (pMyDisasm->Reserved_).EndOfBlock;
    if (uVar3 < UVar2 + 2 && uVar3 != 0) {
LAB_001214d1:
      (pMyDisasm->Reserved_).OutOfBlock = 1;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
      return;
    }
    uVar7 = *(byte *)(UVar2 + 1) >> 3 & 7;
    (pMyDisasm->Reserved_).REGOPCODE = uVar7;
    if (uVar7 == 7) {
      if (uVar3 < UVar2 + 2 && uVar3 != 0) goto LAB_001214d1;
      bVar4 = *(byte *)(UVar2 + 1) >> 6;
      (pMyDisasm->Reserved_).MOD_ = (uint)bVar4;
      if (((pMyDisasm->Reserved_).EVEX.state != '\x01') && (bVar4 != 3))
      goto switchD_0012152a_caseD_4;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpslldq",8);
    }
    else {
      if (uVar7 != 6) goto switchD_0012152a_caseD_4;
      bVar4 = *(byte *)(UVar2 + 1) >> 6;
      (pMyDisasm->Reserved_).MOD_ = (uint)bVar4;
      if (((pMyDisasm->Reserved_).EVEX.state != '\x01') && (bVar4 != 3))
      goto switchD_0012152a_caseD_4;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpsllq",7);
    }
    (pMyDisasm->Instruction).Category = 0x120000;
    UVar1 = (pMyDisasm->Reserved_).VEX.L;
    if (UVar1 == '\0') {
      IVar5 = 0x6d;
      IVar6 = 4;
LAB_001217e9:
      (pMyDisasm->Reserved_).Register_ = IVar6;
      (pMyDisasm->Reserved_).MemDecoration = IVar5;
    }
    else {
      if (UVar1 == '\x01') {
        IVar5 = 0x6e;
        IVar6 = 8;
        goto LAB_001217e9;
      }
      if ((pMyDisasm->Reserved_).EVEX.LL == '\x02') {
        IVar5 = 0x72;
        IVar6 = 0x10;
        goto LAB_001217e9;
      }
    }
    fillRegister((uint)(pMyDisasm->Reserved_).EVEX.V << 4 |
                 ~(uint)(pMyDisasm->Reserved_).VEX.vvvv & 0xf,&pMyDisasm->Operand1,pMyDisasm);
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 2;
    pMyOperand = &pMyDisasm->Operand3;
    goto LAB_00121715;
  }
  UVar2 = (pMyDisasm->Reserved_).EIP_;
  uVar3 = (pMyDisasm->Reserved_).EndOfBlock;
  if (uVar3 < UVar2 + 2 && uVar3 != 0) goto LAB_001214d1;
  uVar7 = (uint)(*(byte *)(UVar2 + 1) >> 6);
  (pMyDisasm->Reserved_).MOD_ = uVar7;
  if (uVar7 != 3) {
switchD_0012152a_caseD_4:
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
    return;
  }
  uVar7 = *(byte *)(UVar2 + 1) >> 3 & 7;
  (pMyDisasm->Reserved_).REGOPCODE = uVar7;
  switch(uVar7) {
  case 2:
    bVar8 = (pMyDisasm->Reserved_).OperandSize == 0x10;
    (pMyDisasm->Instruction).Category = (uint)bVar8 * 0x10000 + 0x30004;
    (pMyDisasm->Reserved_).MemDecoration = (uint)bVar8 * 4 + 4;
    (pMyDisasm->Reserved_).Register_ = (uint)bVar8 * 2 + 2;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).Register_ = 0;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"psrl",4);
    break;
  case 3:
    if ((pMyDisasm->Reserved_).OperandSize != 0x10) goto switchD_0012152a_caseD_4;
    (pMyDisasm->Instruction).Category = 0x40004;
    (pMyDisasm->Reserved_).MemDecoration = 8;
    (pMyDisasm->Reserved_).Register_ = 4;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).Register_ = 0;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"psrl",4);
    goto LAB_001216f7;
  default:
    goto switchD_0012152a_caseD_4;
  case 6:
    bVar8 = (pMyDisasm->Reserved_).OperandSize == 0x10;
    (pMyDisasm->Instruction).Category = (uint)bVar8 * 0x10000 + 0x30004;
    (pMyDisasm->Reserved_).MemDecoration = (uint)bVar8 * 4 + 4;
    (pMyDisasm->Reserved_).Register_ = (uint)bVar8 * 2 + 2;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).Register_ = 0;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"psll",4);
    break;
  case 7:
    if ((pMyDisasm->Reserved_).OperandSize != 0x10) goto switchD_0012152a_caseD_4;
    (pMyDisasm->Instruction).Category = 0x40004;
    (pMyDisasm->Reserved_).MemDecoration = 8;
    (pMyDisasm->Reserved_).ImmediatSize = 8;
    (pMyDisasm->Reserved_).Register_ = 4;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).Register_ = 0;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"psll",4);
LAB_001216f7:
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic + 3,"ldq",4);
    goto LAB_001216fe;
  }
  (pMyDisasm->Instruction).Mnemonic[4] = 'q';
  (pMyDisasm->Instruction).Mnemonic[5] = '\0';
LAB_001216fe:
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  pMyOperand = &pMyDisasm->Operand2;
LAB_00121715:
  getImmediat8(pMyOperand,pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ G14_(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 0) {
      failDecode(pMyDisasm);
    }
    else if (GV.VEX.pp == 1) {
      if (!Security(2, pMyDisasm)) return;
      GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
      if (GV.REGOPCODE == 6) {
        GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
        if (
          (GV.EVEX.state != InUsePrefix) &&
          (GV.MOD_!= 0x3)) {
          failDecode(pMyDisasm);
          return;
        }
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpsllq");
        #endif
        pMyDisasm->Instruction.Category = AVX2_INSTRUCTION;
        if (GV.VEX.L == 0) {
          GV.Register_ = SSE_REG;
          GV.MemDecoration = Arg2_m128_xmm;
        }
        else if (GV.VEX.L == 1) {
          GV.Register_ = AVX_REG;
          GV.MemDecoration = Arg2_m256_ymm;
        }
        else if (GV.EVEX.LL == 2) {
          GV.Register_ = AVX512_REG;
          GV.MemDecoration = Arg2_m512_zmm;
        }
        fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand1, pMyDisasm);
        decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        GV.EIP_+=2;
        getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
      }
      else if (GV.REGOPCODE == 7) {
        if (!Security(2, pMyDisasm)) return;
        GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
        if (
          (GV.EVEX.state != InUsePrefix) &&
          (GV.MOD_!= 0x3)) {
          failDecode(pMyDisasm);
          return;
        }
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpslldq");
        #endif
        pMyDisasm->Instruction.Category = AVX2_INSTRUCTION;
        if (GV.VEX.L == 0) {
          GV.Register_ = SSE_REG;
          GV.MemDecoration = Arg2_m128_xmm;
        }
        else if (GV.VEX.L == 1) {
          GV.Register_ = AVX_REG;
          GV.MemDecoration = Arg2_m256_ymm;
        }
        else if (GV.EVEX.LL == 2) {
          GV.Register_ = AVX512_REG;
          GV.MemDecoration = Arg2_m512_zmm;
        }
        fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand1, pMyDisasm);
        decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        GV.EIP_+=2;
        getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else if (GV.VEX.pp == 2) {
      failDecode(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    if (!Security(2, pMyDisasm)) return;
    GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
    if (GV.MOD_!= 0x3) {
      failDecode(pMyDisasm);
      return;
    }
    GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
    if (GV.REGOPCODE == 2) {
      if (GV.OperandSize == 16) {
        pMyDisasm->Instruction.Category = SSE_INSTRUCTION+SHIFT_ROTATE;
        GV.MemDecoration = Arg1dqword;
        GV.Register_ = SSE_REG;
      }
      else {
        pMyDisasm->Instruction.Category = MMX_INSTRUCTION+SHIFT_ROTATE;
        GV.MemDecoration = Arg1qword;
        GV.Register_ = MMX_REG;
      }
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = 0;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "psrlq");
      #endif
      GV.EIP_ += GV.DECALAGE_EIP+2;
      getImmediat8(&pMyDisasm->Operand2, pMyDisasm);
    }
    else if (GV.REGOPCODE == 3) {
      if (GV.OperandSize == 16) {
        pMyDisasm->Instruction.Category = SSE_INSTRUCTION+SHIFT_ROTATE;
        GV.MemDecoration = Arg1dqword;
        GV.Register_ = SSE_REG;
        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
        GV.Register_ = 0;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "psrldq");
        #endif
        GV.EIP_ += GV.DECALAGE_EIP+2;
        getImmediat8(&pMyDisasm->Operand2, pMyDisasm);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else if (GV.REGOPCODE == 6) {
      if (GV.OperandSize == 16) {
        pMyDisasm->Instruction.Category = SSE_INSTRUCTION+SHIFT_ROTATE;
        GV.MemDecoration = Arg1dqword;
        GV.Register_ = SSE_REG;
      }
      else {
        pMyDisasm->Instruction.Category = MMX_INSTRUCTION+SHIFT_ROTATE;
        GV.MemDecoration = Arg1qword;
        GV.Register_ = MMX_REG;
      }
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = 0;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "psllq");
      #endif
      GV.EIP_ += GV.DECALAGE_EIP+2;
      getImmediat8(&pMyDisasm->Operand2, pMyDisasm);
    }
    else if (GV.REGOPCODE == 7) {
      if (GV.OperandSize == 16) {
        pMyDisasm->Instruction.Category = SSE_INSTRUCTION+SHIFT_ROTATE;
        GV.MemDecoration = Arg1dqword;
        GV.ImmediatSize = 8;
        GV.Register_ = SSE_REG;
        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
        GV.Register_ = 0;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pslldq");
        #endif
        GV.EIP_ += GV.DECALAGE_EIP+2;
        getImmediat8(&pMyDisasm->Operand2, pMyDisasm);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
}